

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O0

void __thiscall
slang::ast::DeclaredType::resolveType
          (DeclaredType *this,ASTContext *typeContext,ASTContext *initializerContext)

{
  SourceRange sourceRange;
  SourceRange assignmentRange;
  bool bVar1;
  Type *pTVar2;
  TypeParameterSymbol *this_00;
  Type *in_RSI;
  undefined8 *in_RDI;
  Type *typedefTarget;
  ImplicitTypeSyntax *its_1;
  bitmask<slang::ast::ASTFlags> extraFlags;
  ImplicitTypeSyntax *its;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_types_DeclaredType_cpp:86:29)>
  guard;
  DataTypeSyntax *syntax;
  Compilation *comp;
  Type *in_stack_fffffffffffffd48;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd50;
  int delta;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  byte bVar3;
  SourceLocation in_stack_fffffffffffffd70;
  SourceLocation in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  DiagCode code;
  undefined8 in_stack_fffffffffffffd98;
  SyntaxKind typeKind;
  Compilation *in_stack_fffffffffffffda0;
  DeclaredType *in_stack_fffffffffffffdc0;
  ASTContext *in_stack_fffffffffffffde0;
  ExpressionSyntax *in_stack_fffffffffffffde8;
  DataTypeSyntax *in_stack_fffffffffffffdf0;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffdf8;
  SourceLocation in_stack_fffffffffffffe00;
  SourceLocation SVar4;
  ASTContext *typeContext_00;
  bool local_181;
  bitmask<slang::ast::DeclaredTypeFlags> local_178;
  bitmask<slang::ast::DeclaredTypeFlags> local_174;
  Type *local_170;
  undefined4 local_164;
  bitmask<slang::ast::ASTFlags> local_160;
  ASTContext *in_stack_fffffffffffffea8;
  DeclaredType *in_stack_fffffffffffffeb0;
  bitmask<slang::ast::ASTFlags> local_120 [8];
  ImplicitTypeSyntax *local_e0;
  bitmask<slang::ast::DeclaredTypeFlags> local_d4 [5];
  Type *local_c0;
  SourceLocation local_b8;
  SourceLocation local_b0;
  SourceRange local_a8 [2];
  bitmask<slang::ast::ASTFlags> local_88;
  bitmask<slang::ast::DeclaredTypeFlags> local_7c;
  bitmask<slang::ast::ASTFlags> local_78;
  SourceRange local_70;
  undefined4 local_60;
  ImplicitTypeSyntax *local_50;
  bitmask<slang::ast::DeclaredTypeFlags> local_44;
  anon_class_8_1_8991fb9c_for_func local_40;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_types_DeclaredType_cpp:86:29)>
  local_38;
  SourceLocation local_28;
  Compilation *local_20;
  Type *local_10;
  
  code = SUB84((ulong)in_stack_fffffffffffffd80 >> 0x20,0);
  typeKind = (SyntaxKind)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_10 = in_RSI;
  local_20 = ASTContext::getCompilation((ASTContext *)0x55b6fc);
  if (*(int *)((long)in_RDI + 0x3c) < 0) {
    pTVar2 = getType(in_stack_fffffffffffffdc0);
    in_RDI[1] = pTVar2;
    if (in_RDI[3] == 0) {
      return;
    }
    pTVar2 = Compilation::getType
                       ((Compilation *)in_stack_fffffffffffffd60.m_bits,
                        (Type *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                        (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                        in_stack_fffffffffffffd50.m_bits,(ASTContext *)in_stack_fffffffffffffd48);
    in_RDI[1] = pTVar2;
    return;
  }
  local_28 = *(SourceLocation *)(in_RDI + 2);
  if (local_28 == (SourceLocation)0x0) {
    pTVar2 = Compilation::getErrorType(local_20);
    in_RDI[1] = pTVar2;
    return;
  }
  *(uint *)((long)in_RDI + 0x3c) = *(uint *)((long)in_RDI + 0x3c) & 0xbfffffff | 0x40000000;
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/types/DeclaredType.cpp:86:29)>
  ::ScopeGuard(&local_38,&local_40);
  local_181 = false;
  if (*(int *)local_28 == 0xf7) {
    bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_44,InferImplicit);
    local_181 = bitmask<slang::ast::DeclaredTypeFlags>::has
                          ((bitmask<slang::ast::DeclaredTypeFlags> *)
                           in_stack_fffffffffffffd50.m_bits,
                           (bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffd48);
  }
  if (local_181 == false) {
    bitmask<slang::ast::DeclaredTypeFlags>::bitmask(local_d4,InterconnectNet);
    bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                      ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffd50.m_bits,
                       (bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffd48);
    if (bVar1) {
      pTVar2 = Compilation::getType(in_stack_fffffffffffffda0,typeKind);
      in_RDI[1] = pTVar2;
      if (*(int *)local_28 == 0xf7) {
        local_e0 = slang::syntax::SyntaxNode::as<slang::syntax::ImplicitTypeSyntax>
                             ((SyntaxNode *)local_28);
        bVar1 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                          ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *
                           )0x55bcd1);
        if (!bVar1) {
          bitmask<slang::ast::ASTFlags>::bitmask(local_120,AllowInterconnect);
          ASTContext::resetFlags
                    ((ASTContext *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                     in_stack_fffffffffffffd60);
          pTVar2 = Compilation::getType
                             ((Compilation *)in_stack_fffffffffffffd60.m_bits,
                              (Type *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                              (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                              in_stack_fffffffffffffd50.m_bits,
                              (ASTContext *)in_stack_fffffffffffffd48);
          in_RDI[1] = pTVar2;
        }
      }
      if (in_RDI[3] != 0) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_160,AllowInterconnect);
        ASTContext::resetFlags
                  ((ASTContext *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                   in_stack_fffffffffffffd60);
        pTVar2 = Compilation::getType
                           ((Compilation *)in_stack_fffffffffffffd60.m_bits,
                            (Type *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                            (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                            in_stack_fffffffffffffd50.m_bits,(ASTContext *)in_stack_fffffffffffffd48
                           );
        in_RDI[1] = pTVar2;
      }
      local_164 = 1;
      goto LAB_0055c03c;
    }
    local_170 = (Type *)0x0;
    bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_174,TypedefTarget);
    bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                      ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffd50.m_bits,
                       (bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffd48);
    if (bVar1) {
      if (*(int *)*in_RDI == 0x28) {
        this_00 = Symbol::as<slang::ast::TypeParameterSymbol>((Symbol *)0x55beb7);
        local_170 = TypeParameterSymbol::getTypeAlias(this_00);
      }
      else {
        local_170 = Symbol::as<slang::ast::Type>((Symbol *)0x55beee);
      }
    }
    pTVar2 = Compilation::getType
                       ((Compilation *)in_stack_fffffffffffffd60.m_bits,
                        (DataTypeSyntax *)
                        CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                        (ASTContext *)in_stack_fffffffffffffd50.m_bits,in_stack_fffffffffffffd48);
    in_RDI[1] = pTVar2;
    if (in_RDI[3] != 0) {
      pTVar2 = Compilation::getType
                         ((Compilation *)in_stack_fffffffffffffd60.m_bits,
                          (Type *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                          (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                          in_stack_fffffffffffffd50.m_bits,(ASTContext *)in_stack_fffffffffffffd48);
      in_RDI[1] = pTVar2;
    }
    if (local_170 != (Type *)0x0) {
      Type::getCanonicalType((Type *)in_stack_fffffffffffffd50.m_bits);
    }
  }
  else if (in_RDI[3] == 0) {
    if (in_RDI[5] == 0) {
      pTVar2 = Compilation::getErrorType(local_20);
      in_RDI[1] = pTVar2;
    }
    else {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_78);
      typeContext_00 = (ASTContext *)(in_RDI + 7);
      bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_7c,AllowUnboundedLiteral);
      bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                        ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffd50.m_bits,
                         (bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffd48);
      delta = (int)(in_stack_fffffffffffffd50.m_bits >> 0x20);
      if (bVar1) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_88,AllowUnboundedLiteral);
        local_78.m_bits = local_88.m_bits;
      }
      local_b0 = *(SourceLocation *)(in_RDI + 6);
      SVar4 = local_28;
      local_b8 = SourceLocation::operator+<int>
                           ((SourceLocation *)
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),delta);
      SourceRange::SourceRange(local_a8,local_b0,local_b8);
      local_c0 = (Type *)local_78.m_bits;
      assignmentRange.endLoc = SVar4;
      assignmentRange.startLoc = in_stack_fffffffffffffe00;
      in_stack_fffffffffffffd50.m_bits = local_78.m_bits;
      Expression::bindImplicitParam
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,assignmentRange,
                 in_stack_fffffffffffffde0,typeContext_00,in_stack_fffffffffffffdf8);
      std::tie<slang::ast::Expression_const*,slang::ast::Type_const*>
                ((Expression **)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                 (Type **)in_stack_fffffffffffffd50.m_bits);
      std::tuple<slang::ast::Expression_const*&,slang::ast::Type_const*&>::operator=
                ((tuple<const_slang::ast::Expression_*&,_const_slang::ast::Type_*&> *)
                 in_stack_fffffffffffffd50.m_bits,
                 (tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*> *)local_10);
      in_stack_fffffffffffffd48 = local_10;
    }
  }
  else {
    local_50 = slang::syntax::SyntaxNode::as<slang::syntax::ImplicitTypeSyntax>
                         ((SyntaxNode *)local_28);
    bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x55b8b1);
    if ((bVar1) ||
       (bVar1 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                          ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *
                           )0x55b8dc), !bVar1)) {
      pTVar2 = Compilation::getType
                         ((Compilation *)in_stack_fffffffffffffd60.m_bits,
                          (DataTypeSyntax *)
                          CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                          (ASTContext *)in_stack_fffffffffffffd50.m_bits,in_stack_fffffffffffffd48);
      in_RDI[1] = pTVar2;
      pTVar2 = Compilation::getType
                         ((Compilation *)in_stack_fffffffffffffd60.m_bits,
                          (Type *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                          (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                          in_stack_fffffffffffffd50.m_bits,(ASTContext *)in_stack_fffffffffffffd48);
      in_RDI[1] = pTVar2;
    }
    else {
      local_60 = 0xd30006;
      local_70 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffda0);
      sourceRange.endLoc = in_stack_fffffffffffffd78;
      sourceRange.startLoc = in_stack_fffffffffffffd70;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),code,
                          sourceRange);
      pTVar2 = Compilation::getErrorType(local_20);
      in_RDI[1] = pTVar2;
    }
  }
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_178,NeedsTypeCheck);
  bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                    ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffd50.m_bits,
                     (bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffd48);
  bVar3 = 0;
  if (bVar1) {
    bVar1 = Type::isError((Type *)0x55bffe);
    bVar3 = bVar1 ^ 0xff;
  }
  if ((bVar3 & 1) != 0) {
    checkType(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  local_164 = 0;
LAB_0055c03c:
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/types/DeclaredType.cpp:86:29)>
  ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_ast_types_DeclaredType_cpp:86:29)>
                 *)in_stack_fffffffffffffd50.m_bits);
  return;
}

Assistant:

void DeclaredType::resolveType(const ASTContext& typeContext,
                               const ASTContext& initializerContext) const {
    auto& comp = typeContext.getCompilation();
    if (hasLink) {
        SLANG_ASSERT(typeOrLink.link);
        type = &typeOrLink.link->getType();
        if (dimensions)
            type = &comp.getType(*type, *dimensions, typeContext);
        return;
    }

    auto syntax = typeOrLink.typeSyntax;
    SLANG_ASSERT(syntax);
    if (!syntax) {
        type = &comp.getErrorType();
        return;
    }

    SLANG_ASSERT(!evaluating);
    evaluating = true;
    auto guard = ScopeGuard([this] { evaluating = false; });

    // If we are configured to infer implicit types, bind the initializer expression
    // first so that we can derive our type from whatever that happens to be.
    if (syntax->kind == SyntaxKind::ImplicitType && flags.has(DeclaredTypeFlags::InferImplicit)) {
        if (dimensions) {
            auto& its = syntax->as<ImplicitTypeSyntax>();
            if (its.signing || !its.dimensions.empty()) {
                type = &comp.getType(*syntax, typeContext, nullptr);
                type = &comp.getType(*type, *dimensions, typeContext);
            }
            else {
                typeContext.addDiag(diag::UnpackedArrayParamType, dimensions->sourceRange());
                type = &comp.getErrorType();
            }
        }
        else if (!initializerSyntax) {
            type = &comp.getErrorType();
        }
        else {
            bitmask<ASTFlags> extraFlags;
            if (flags.has(DeclaredTypeFlags::AllowUnboundedLiteral))
                extraFlags = ASTFlags::AllowUnboundedLiteral;

            std::tie(initializer, type) = Expression::bindImplicitParam(
                *syntax, *initializerSyntax, {initializerLocation, initializerLocation + 1},
                initializerContext, typeContext, extraFlags);
            SLANG_ASSERT(initializer);
        }
    }
    else if (flags.has(DeclaredTypeFlags::InterconnectNet)) {
        // An interconnect net is always untyped (or some array of untyped elements).
        type = &comp.getType(SyntaxKind::Untyped);
        if (syntax->kind == SyntaxKind::ImplicitType) {
            // This should always be an implicit type unless there's an
            // error (diagnosed by the parser).
            auto& its = syntax->as<ImplicitTypeSyntax>();
            if (!its.dimensions.empty())
                type = &comp.getType(*type, its.dimensions,
                                     typeContext.resetFlags(ASTFlags::AllowInterconnect));
        }

        if (dimensions) {
            type = &comp.getType(*type, *dimensions,
                                 typeContext.resetFlags(ASTFlags::AllowInterconnect));
        }

        // Return early to skip additional checks for net types.
        return;
    }
    else {
        const Type* typedefTarget = nullptr;
        if (flags.has(DeclaredTypeFlags::TypedefTarget)) {
            if (parent.kind == SymbolKind::TypeParameter)
                typedefTarget = &parent.as<TypeParameterSymbol>().getTypeAlias();
            else
                typedefTarget = &parent.as<Type>();
        }

        type = &comp.getType(*syntax, typeContext, typedefTarget);
        if (dimensions)
            type = &comp.getType(*type, *dimensions, typeContext);

        if (typedefTarget) {
            // When resolving a typedef target we need to force resolution
            // of the canonical type to make sure there are no cycles.
            type->getCanonicalType();
        }
    }

    if (flags.has(DeclaredTypeFlags::NeedsTypeCheck) && !type->isError())
        checkType(initializerContext);
}